

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O1

PCMTrack * __thiscall Storage::Disk::PCMTrack::resampled_clone(PCMTrack *this,size_t bits_per_track)

{
  pointer pPVar1;
  PCMTrack *this_00;
  PCMSegment *segment;
  unsigned_long uVar2;
  uint uVar3;
  _Ct __m2;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  _Ct __n2;
  ulong __n;
  PCMSegmentEventSource *event_source;
  pointer this_01;
  Time start_time;
  Time local_40;
  Time local_38;
  
  this_00 = (PCMTrack *)operator_new(0x30);
  PCMTrack(this_00,(uint)bits_per_track);
  local_40.length = 0;
  local_40.clock_rate = 1;
  this_01 = (this->segment_event_sources_).
            super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->segment_event_sources_).
           super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pPVar1) {
    do {
      segment = PCMSegmentEventSource::segment(this_01);
      add_segment(this_00,&local_40,segment,true);
      Time::Time(&local_38,
                 (ulong)((*(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_finish.
                                   super__Bit_iterator_base._M_p -
                         *(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                         * 8 + (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                        ) * (ulong)(segment->length_of_a_bit).length,
                 (ulong)(segment->length_of_a_bit).clock_rate);
      if (local_38.length != 0) {
        uVar4 = (ulong)local_40 & 0xffffffff;
        if (uVar4 == 0) {
          local_40 = local_38;
        }
        else {
          __n = (ulong)local_40.clock_rate;
          if (local_40.clock_rate == local_38.clock_rate) {
            uVar4 = ((ulong)local_38 & 0xffffffff) + uVar4;
          }
          else {
            uVar4 = ((ulong)local_38 & 0xffffffff) * __n + uVar4 * ((ulong)local_38 >> 0x20);
            __n = __n * ((ulong)local_38 >> 0x20);
          }
          if ((__n | uVar4) >> 0x20 == 0) {
LAB_0044aa62:
            local_40.clock_rate = (uint)__n;
            local_40.length = (uint)uVar4;
          }
          else if (uVar4 == 0) {
            local_40.length = 0;
            local_40.clock_rate = 1;
          }
          else {
            uVar5 = uVar4;
            if (((__n | uVar4) & 0xf) == 0) {
              do {
                uVar4 = uVar5 >> 4;
                uVar3 = (uint)uVar5;
                uVar6 = (uint)__n;
                __n = __n >> 4;
                uVar5 = uVar4;
              } while (((uVar3 | uVar6) & 0xf0) == 0);
            }
            uVar3 = ((uint)uVar4 | (uint)__n) & 1;
            while (uVar3 == 0) {
              uVar3 = (uint)__n;
              __n = __n >> 1;
              uVar3 = ((uint)uVar4 | uVar3) & 2;
              uVar4 = uVar4 >> 1;
            }
            if ((uVar4 >> 0x20 != 0) || (__n >> 0x20 != 0)) {
              uVar2 = std::__detail::__gcd<unsigned_long>(uVar4,__n);
              uVar4 = uVar4 / uVar2;
              __n = __n / uVar2;
              do {
                if (uVar4 >> 0x20 == 0) {
                  if (__n >> 0x20 == 0) break;
                }
                else if (__n < 2) break;
                uVar4 = uVar4 >> 1;
                __n = __n >> 1;
              } while( true );
            }
            if ((uVar4 >> 0x20 == 0) && (__n >> 0x20 == 0)) goto LAB_0044aa62;
            local_40.length = 0xffffffff;
            local_40.clock_rate = 1;
          }
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pPVar1);
  }
  this_00->is_resampled_clone_ = true;
  return this_00;
}

Assistant:

PCMTrack *PCMTrack::resampled_clone(size_t bits_per_track) {
	// Create an empty track.
	PCMTrack *const new_track = new PCMTrack(unsigned(bits_per_track));

	// Plot all segments from this track onto the destination.
	Time start_time;
	for(const auto &event_source: segment_event_sources_) {
		const PCMSegment &source = event_source.segment();
		new_track->add_segment(start_time, source, true);
		start_time += source.length();
	}

	new_track->is_resampled_clone_ = true;
	return new_track;
}